

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O2

int test_HTMLparser(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  htmlDocPtr pxVar29;
  char *pcVar30;
  htmlParserCtxtPtr pxVar31;
  char *pcVar32;
  htmlDocPtr pxVar33;
  xmlParserCtxtPtr pxVar34;
  xmlChar *pxVar35;
  int *piVar36;
  undefined8 uVar37;
  int nr;
  int nr_00;
  int n_doc;
  uint uVar38;
  int iVar39;
  uint no;
  ulong uVar40;
  undefined8 *puVar41;
  undefined4 *puVar42;
  int test_ret_3;
  int iVar43;
  undefined8 uVar44;
  int *in_RSI;
  int test_ret_5;
  bool bVar45;
  int test_ret_7;
  undefined4 uVar46;
  int n_filename;
  uint uVar47;
  int local_8c;
  int test_ret_2;
  int local_7c;
  int test_ret_4;
  int test_ret_1;
  int test_ret_12;
  int local_50;
  int local_4c;
  int test_ret_11;
  int test_ret;
  
  if (quiet == '\0') {
    puts("Testing HTMLparser : 37 of 43 functions ...");
  }
  pxVar29 = (htmlDocPtr)0x1;
  iVar1 = 0;
  while (pxVar29 != (htmlDocPtr)0x0) {
    uVar40 = 0;
    while( true ) {
      pxVar29 = (htmlDocPtr)0x0;
      iVar43 = (int)uVar40;
      if (iVar43 == 5) break;
      while( true ) {
        iVar3 = (int)in_RSI;
        iVar4 = (int)pxVar29;
        if (iVar4 == 4) break;
        iVar2 = xmlMemBlocks();
        in_RSI = (int *)gen_const_xmlChar_ptr(iVar43,iVar3);
        iVar3 = gen_int(iVar4,iVar3);
        htmlAttrAllowed(0,in_RSI,iVar3);
        call_tests = call_tests + 1;
        xmlResetLastError();
        iVar3 = xmlMemBlocks();
        if (iVar2 != iVar3) {
          iVar3 = xmlMemBlocks();
          printf("Leak of %d blocks found in htmlAttrAllowed",(ulong)(uint)(iVar3 - iVar2));
          iVar1 = iVar1 + 1;
          printf(" %d",0);
          printf(" %d",uVar40);
          printf(" %d");
          putchar(10);
          in_RSI = (int *)pxVar29;
        }
        pxVar29 = (htmlDocPtr)(ulong)(iVar4 + 1);
      }
      uVar40 = (ulong)(iVar43 + 1);
    }
  }
  function_tests = function_tests + 1;
  local_7c = 0;
  uVar40 = 0;
  while (iVar43 = (int)uVar40, iVar43 != 3) {
    for (iVar3 = 0; iVar3 != 5; iVar3 = iVar3 + 1) {
      bVar45 = true;
      while (iVar4 = (int)in_RSI, bVar45) {
        iVar2 = xmlMemBlocks();
        pxVar29 = gen_htmlDocPtr(iVar43,iVar4);
        in_RSI = (int *)gen_const_xmlChar_ptr(iVar3,iVar4);
        htmlAutoCloseTag(pxVar29,in_RSI,0);
        call_tests = call_tests + 1;
        des_htmlDocPtr((int)pxVar29,(htmlDocPtr)in_RSI,nr);
        xmlResetLastError();
        iVar4 = xmlMemBlocks();
        if (iVar2 == iVar4) break;
        iVar4 = xmlMemBlocks();
        bVar45 = false;
        printf("Leak of %d blocks found in htmlAutoCloseTag",(ulong)(uint)(iVar4 - iVar2));
        local_7c = local_7c + 1;
        printf(" %d",uVar40);
        printf(" %d");
        in_RSI = (int *)0x0;
        printf(" %d");
        putchar(10);
      }
    }
    uVar40 = (ulong)(iVar43 + 1);
  }
  function_tests = function_tests + 1;
  iVar43 = 0;
  for (uVar47 = 0; uVar47 != 6; uVar47 = uVar47 + 1) {
    pxVar29 = (htmlDocPtr)0x0;
    puVar41 = &DAT_00159d68;
    while( true ) {
      iVar3 = (int)in_RSI;
      uVar6 = (uint)pxVar29;
      if (uVar6 == 4) break;
      iVar4 = xmlMemBlocks();
      pcVar30 = gen_fileoutput(uVar47,iVar3);
      if (uVar6 < 3) {
        in_RSI = (int *)*puVar41;
      }
      else {
        in_RSI = (int *)0x0;
      }
      pxVar31 = (htmlParserCtxtPtr)htmlCreateFileParserCtxt(pcVar30);
      desret_htmlParserCtxtPtr(pxVar31);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar3 = xmlMemBlocks();
      if (iVar4 != iVar3) {
        iVar3 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCreateFileParserCtxt",(ulong)(uint)(iVar3 - iVar4));
        iVar43 = iVar43 + 1;
        printf(" %d",(ulong)uVar47);
        printf(" %d");
        putchar(10);
        in_RSI = (int *)pxVar29;
      }
      pxVar29 = (htmlDocPtr)(ulong)(uVar6 + 1);
      puVar41 = puVar41 + 1;
    }
  }
  function_tests = function_tests + 1;
  iVar3 = 0;
  for (uVar47 = 0; uVar47 != 4; uVar47 = uVar47 + 1) {
    pxVar29 = (htmlDocPtr)0x0;
    while( true ) {
      iVar4 = (int)in_RSI;
      iVar2 = (int)pxVar29;
      if (iVar2 == 4) break;
      iVar5 = xmlMemBlocks();
      if (uVar47 == 0) {
        bVar45 = false;
        pcVar30 = "foo";
      }
      else if (uVar47 == 2) {
        bVar45 = false;
        pcVar30 = "test/ent2";
      }
      else if (uVar47 == 1) {
        bVar45 = false;
        pcVar30 = "<foo/>";
      }
      else {
        bVar45 = true;
        pcVar30 = (char *)0x0;
      }
      uVar6 = gen_int(iVar2,iVar4);
      in_RSI = (int *)(ulong)uVar6;
      if (!bVar45) {
        iVar4 = xmlStrlen(pcVar30);
        in_RSI = (int *)(ulong)uVar6;
        if (iVar4 < (int)uVar6) {
          in_RSI = (int *)0x0;
        }
      }
      pxVar31 = (htmlParserCtxtPtr)htmlCreateMemoryParserCtxt(pcVar30);
      desret_htmlParserCtxtPtr(pxVar31);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar5 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCreateMemoryParserCtxt",(ulong)(uint)(iVar4 - iVar5))
        ;
        iVar3 = iVar3 + 1;
        printf(" %d",(ulong)uVar47);
        printf(" %d");
        putchar(10);
        in_RSI = (int *)pxVar29;
      }
      pxVar29 = (htmlDocPtr)(ulong)(iVar2 + 1);
    }
  }
  function_tests = function_tests + 1;
  uVar47 = 1;
  iVar4 = 0;
  while (uVar47 != 0) {
    for (uVar6 = 0; uVar47 = 0, uVar6 != 3; uVar6 = uVar6 + 1) {
      for (; uVar47 != 4; uVar47 = uVar47 + 1) {
        for (iVar2 = 0; iVar2 != 4; iVar2 = iVar2 + 1) {
          for (uVar7 = 0; uVar7 != 6; uVar7 = uVar7 + 1) {
            _test_ret_4 = &DAT_001490bc;
            for (uVar38 = 0; iVar5 = (int)in_RSI, uVar38 != 4; uVar38 = uVar38 + 1) {
              iVar8 = xmlMemBlocks();
              in_RSI = &call_tests;
              if (uVar6 != 0) {
                if (uVar6 == 1) {
                  in_RSI = (int *)0xffffffffffffffff;
                }
                else {
                  in_RSI = (int *)0x0;
                }
              }
              if (uVar47 == 0) {
                bVar45 = false;
                pcVar30 = "foo";
              }
              else if (uVar47 == 2) {
                bVar45 = false;
                pcVar30 = "test/ent2";
              }
              else if (uVar47 == 1) {
                bVar45 = false;
                pcVar30 = "<foo/>";
              }
              else {
                bVar45 = true;
                pcVar30 = (char *)0x0;
              }
              iVar9 = gen_int(iVar2,iVar5);
              pcVar32 = gen_fileoutput(uVar7,iVar5);
              uVar46 = 0xffffffff;
              if (uVar38 < 3) {
                uVar46 = *_test_ret_4;
              }
              if ((!bVar45) && (iVar5 = xmlStrlen(pcVar30), iVar5 < iVar9)) {
                iVar9 = 0;
              }
              pxVar31 = (htmlParserCtxtPtr)
                        htmlCreatePushParserCtxt(0,in_RSI,pcVar30,iVar9,pcVar32,uVar46);
              desret_htmlParserCtxtPtr(pxVar31);
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar5 = xmlMemBlocks();
              if (iVar8 != iVar5) {
                iVar5 = xmlMemBlocks();
                printf("Leak of %d blocks found in htmlCreatePushParserCtxt",
                       (ulong)(uint)(iVar5 - iVar8));
                iVar4 = iVar4 + 1;
                printf(" %d",0);
                printf(" %d",(ulong)uVar6);
                printf(" %d",(ulong)uVar47);
                printf(" %d",iVar2);
                printf(" %d",(ulong)uVar7);
                in_RSI = (int *)(ulong)uVar38;
                printf(" %d");
                putchar(10);
              }
              _test_ret_4 = _test_ret_4 + 1;
            }
          }
        }
      }
    }
  }
  function_tests = function_tests + 1;
  test_ret_1 = 0;
  for (iVar2 = 0; iVar2 != 3; iVar2 = iVar2 + 1) {
    bVar45 = true;
    while (iVar5 = (int)in_RSI, bVar45) {
      iVar8 = xmlMemBlocks();
      pxVar31 = gen_htmlParserCtxtPtr(iVar2,iVar5);
      in_RSI = (int *)0x0;
      pxVar29 = (htmlDocPtr)htmlCtxtParseDocument(pxVar31);
      desret_htmlDocPtr(pxVar29);
      call_tests = call_tests + 1;
      if (pxVar31 != (htmlParserCtxtPtr)0x0) {
        htmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar5 = xmlMemBlocks();
      if (iVar8 == iVar5) break;
      iVar5 = xmlMemBlocks();
      bVar45 = false;
      printf("Leak of %d blocks found in htmlCtxtParseDocument",(ulong)(uint)(iVar5 - iVar8));
      test_ret_1 = test_ret_1 + 1;
      printf(" %d");
      in_RSI = (int *)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  local_50 = 0;
  for (uVar47 = 0; uVar47 != 3; uVar47 = uVar47 + 1) {
    for (iVar2 = 0; iVar2 != 5; iVar2 = iVar2 + 1) {
      uVar40 = 0;
      while (uVar6 = (uint)uVar40, uVar6 != 4) {
        for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
          pxVar29 = (htmlDocPtr)0x0;
          while( true ) {
            iVar8 = (int)in_RSI;
            iVar5 = (int)pxVar29;
            if (iVar5 == 4) break;
            iVar9 = xmlMemBlocks();
            pxVar31 = gen_htmlParserCtxtPtr(uVar47,iVar8);
            in_RSI = (int *)gen_const_xmlChar_ptr(iVar2,iVar8);
            if (uVar6 < 3) {
              uVar44 = (&DAT_00159d68)[uVar40];
            }
            else {
              uVar44 = 0;
            }
            if (uVar7 < 3) {
              uVar37 = (&DAT_00159d68)[uVar7];
            }
            else {
              uVar37 = 0;
            }
            iVar8 = gen_int(iVar5,iVar8);
            pxVar33 = (htmlDocPtr)htmlCtxtReadDoc(pxVar31,in_RSI,uVar44,uVar37,iVar8);
            desret_htmlDocPtr(pxVar33);
            call_tests = call_tests + 1;
            if (pxVar31 != (htmlParserCtxtPtr)0x0) {
              htmlFreeParserCtxt();
            }
            xmlResetLastError();
            iVar8 = xmlMemBlocks();
            if (iVar9 != iVar8) {
              iVar8 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlCtxtReadDoc",(ulong)(uint)(iVar8 - iVar9));
              local_50 = local_50 + 1;
              printf(" %d",(ulong)uVar47);
              printf(" %d",iVar2);
              printf(" %d",uVar40);
              printf(" %d",uVar7);
              printf(" %d");
              putchar(10);
              in_RSI = (int *)pxVar29;
            }
            pxVar29 = (htmlDocPtr)(ulong)(iVar5 + 1);
          }
        }
        uVar40 = (ulong)(uVar6 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  for (iVar2 = 0; iVar2 != 3; iVar2 = iVar2 + 1) {
    for (iVar5 = 0; iVar5 != 8; iVar5 = iVar5 + 1) {
      uVar40 = 0;
      while (uVar47 = (uint)uVar40, uVar47 != 4) {
        for (iVar8 = 0; iVar9 = (int)in_RSI, iVar8 != 4; iVar8 = iVar8 + 1) {
          pxVar31 = gen_htmlParserCtxtPtr(iVar2,iVar9);
          in_RSI = (int *)gen_filepath(iVar5,iVar9);
          if (uVar47 < 3) {
            uVar44 = (&DAT_00159d68)[uVar40];
          }
          else {
            uVar44 = 0;
          }
          iVar9 = gen_int(iVar8,iVar9);
          pxVar29 = (htmlDocPtr)htmlCtxtReadFile(pxVar31,in_RSI,uVar44,iVar9);
          desret_htmlDocPtr(pxVar29);
          call_tests = call_tests + 1;
          if (pxVar31 != (htmlParserCtxtPtr)0x0) {
            htmlFreeParserCtxt(pxVar31);
          }
          xmlResetLastError();
        }
        uVar40 = (ulong)(uVar47 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  local_4c = 0;
  for (iVar2 = 0; iVar2 != 3; iVar2 = iVar2 + 1) {
    pcVar30 = (char *)in_RSI;
    for (iVar5 = 0; iVar5 != 4; iVar5 = iVar5 + 1) {
      for (iVar8 = 0; iVar8 != 4; iVar8 = iVar8 + 1) {
        uVar40 = 0;
        while (uVar47 = (uint)uVar40, uVar47 != 4) {
          for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
            for (uVar7 = 0; iVar9 = (int)pcVar30, uVar7 != 4; uVar7 = uVar7 + 1) {
              iVar10 = xmlMemBlocks();
              pxVar31 = gen_htmlParserCtxtPtr(iVar2,iVar9);
              if (iVar5 == 0) {
                bVar45 = false;
                pcVar30 = "foo";
              }
              else if (iVar5 == 2) {
                bVar45 = false;
                pcVar30 = "test/ent2";
              }
              else if (iVar5 == 1) {
                bVar45 = false;
                pcVar30 = "<foo/>";
              }
              else {
                bVar45 = true;
                pcVar30 = (char *)0x0;
              }
              iVar11 = gen_int(iVar8,iVar9);
              if (uVar47 < 3) {
                uVar44 = (&DAT_00159d68)[uVar40];
              }
              else {
                uVar44 = 0;
              }
              if (uVar6 < 3) {
                uVar37 = (&DAT_00159d68)[uVar6];
              }
              else {
                uVar37 = 0;
              }
              iVar9 = gen_int(uVar7,iVar9);
              if ((!bVar45) && (iVar12 = xmlStrlen(pcVar30), iVar12 < iVar11)) {
                iVar11 = 0;
              }
              pxVar29 = (htmlDocPtr)htmlCtxtReadMemory(pxVar31,pcVar30,iVar11,uVar44,uVar37,iVar9);
              desret_htmlDocPtr(pxVar29);
              call_tests = call_tests + 1;
              if (pxVar31 != (htmlParserCtxtPtr)0x0) {
                htmlFreeParserCtxt();
              }
              xmlResetLastError();
              iVar9 = xmlMemBlocks();
              if (iVar10 != iVar9) {
                iVar9 = xmlMemBlocks();
                printf("Leak of %d blocks found in htmlCtxtReadMemory",(ulong)(uint)(iVar9 - iVar10)
                      );
                local_4c = local_4c + 1;
                printf(" %d",iVar2);
                printf(" %d",iVar5);
                printf(" %d",iVar8);
                printf(" %d",uVar40);
                printf(" %d",uVar6);
                pcVar30 = (char *)(ulong)uVar7;
                printf(" %d");
                putchar(10);
              }
            }
          }
          uVar40 = (ulong)(uVar47 + 1);
        }
      }
    }
    in_RSI = (int *)pcVar30;
  }
  function_tests = function_tests + 1;
  iVar2 = 0;
  for (uVar47 = 0; uVar47 != 3; uVar47 = uVar47 + 1) {
    iVar5 = xmlMemBlocks();
    pxVar31 = gen_htmlParserCtxtPtr(uVar47,(int)in_RSI);
    htmlCtxtReset();
    call_tests = call_tests + 1;
    if (pxVar31 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar8 = xmlMemBlocks();
    if (iVar5 != iVar8) {
      iVar8 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlCtxtReset",(ulong)(uint)(iVar8 - iVar5));
      iVar2 = iVar2 + 1;
      in_RSI = (int *)(ulong)uVar47;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar5 = 0;
  for (uVar47 = 0; uVar47 != 3; uVar47 = uVar47 + 1) {
    pxVar29 = (htmlDocPtr)0x0;
    while( true ) {
      iVar8 = (int)in_RSI;
      iVar9 = (int)pxVar29;
      if (iVar9 == 4) break;
      iVar10 = xmlMemBlocks();
      pxVar34 = gen_xmlParserCtxtPtr(uVar47,iVar8);
      uVar6 = gen_int(iVar9,iVar8);
      in_RSI = (int *)(ulong)uVar6;
      htmlCtxtSetOptions();
      call_tests = call_tests + 1;
      if (pxVar34 != (xmlParserCtxtPtr)0x0) {
        xmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar8 = xmlMemBlocks();
      if (iVar10 != iVar8) {
        iVar8 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCtxtSetOptions",(ulong)(uint)(iVar8 - iVar10));
        iVar5 = iVar5 + 1;
        printf(" %d",(ulong)uVar47);
        printf(" %d");
        putchar(10);
        in_RSI = (int *)pxVar29;
      }
      pxVar29 = (htmlDocPtr)(ulong)(iVar9 + 1);
    }
  }
  iVar1 = local_7c + iVar1 + iVar43 + iVar3 + iVar4 + test_ret_1 + local_50 + local_4c;
  function_tests = function_tests + 1;
  iVar43 = 0;
  uVar40 = 0;
  while (iVar3 = (int)uVar40, iVar3 != 3) {
    pxVar29 = (htmlDocPtr)0x0;
    while( true ) {
      iVar4 = (int)in_RSI;
      iVar8 = (int)pxVar29;
      if (iVar8 == 4) break;
      iVar9 = xmlMemBlocks();
      pxVar31 = gen_htmlParserCtxtPtr(iVar3,iVar4);
      uVar47 = gen_int(iVar8,iVar4);
      in_RSI = (int *)(ulong)uVar47;
      htmlCtxtUseOptions();
      call_tests = call_tests + 1;
      if (pxVar31 != (htmlParserCtxtPtr)0x0) {
        htmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar9 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlCtxtUseOptions",(ulong)(uint)(iVar4 - iVar9));
        iVar43 = iVar43 + 1;
        printf(" %d",uVar40);
        printf(" %d");
        putchar(10);
        in_RSI = (int *)pxVar29;
      }
      pxVar29 = (htmlDocPtr)(ulong)(iVar8 + 1);
    }
    uVar40 = (ulong)(iVar3 + 1);
  }
  function_tests = function_tests + 1;
  bVar45 = true;
  iVar3 = 0;
  while (bVar45) {
    pxVar29 = (htmlDocPtr)0x0;
    while( true ) {
      iVar4 = (int)in_RSI;
      iVar8 = (int)pxVar29;
      if (iVar8 == 5) break;
      iVar9 = xmlMemBlocks();
      in_RSI = (int *)gen_const_xmlChar_ptr(iVar8,iVar4);
      htmlElementAllowedHere();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar4 = xmlMemBlocks();
      if (iVar9 != iVar4) {
        iVar4 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlElementAllowedHere",(ulong)(uint)(iVar4 - iVar9));
        iVar3 = iVar3 + 1;
        printf(" %d",0);
        printf(" %d");
        putchar(10);
        in_RSI = (int *)pxVar29;
      }
      pxVar29 = (htmlDocPtr)(ulong)(iVar8 + 1);
    }
    bVar45 = false;
  }
  function_tests = function_tests + 1;
  iVar4 = 0;
  bVar45 = true;
LAB_001175f6:
  if (bVar45) {
    bVar45 = true;
    while (bVar45) {
      iVar8 = xmlMemBlocks();
      bVar45 = false;
      in_RSI = (int *)0x0;
      htmlElementStatusHere(0);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar9 = xmlMemBlocks();
      if (iVar8 == iVar9) goto LAB_001175f6;
      xmlMemBlocks();
      bVar45 = false;
      printf("Leak of %d blocks found in htmlElementStatusHere");
      iVar4 = iVar4 + 1;
      printf(" %d");
      in_RSI = (int *)0x0;
      printf(" %d");
      putchar(10);
    }
    bVar45 = false;
    goto LAB_001175f6;
  }
  function_tests = function_tests + 1;
  bVar45 = true;
  local_8c = 0;
  while (bVar45) {
    for (iVar8 = 0; iVar8 != 2; iVar8 = iVar8 + 1) {
      pxVar29 = (htmlDocPtr)0x0;
      if (iVar8 == 0) {
        pxVar29 = (htmlDocPtr)(inttab + 1);
      }
      pxVar33 = (htmlDocPtr)0x1;
      while (pxVar33 != (htmlDocPtr)0x0) {
        uVar40 = 0;
        while( true ) {
          pxVar33 = (htmlDocPtr)0x0;
          iVar9 = (int)uVar40;
          if (iVar9 == 2) break;
          uVar44 = 0;
          if (iVar9 == 0) {
            uVar44 = 0x15c40c;
          }
          while( true ) {
            iVar11 = (int)in_RSI;
            iVar10 = (int)pxVar33;
            if (iVar10 == 4) break;
            iVar12 = xmlMemBlocks();
            iVar11 = gen_int(iVar10,iVar11);
            in_RSI = (int *)pxVar29;
            htmlEncodeEntities(0,pxVar29,0,uVar44,iVar11);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar11 = xmlMemBlocks();
            if (iVar12 != iVar11) {
              iVar11 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlEncodeEntities",(ulong)(uint)(iVar11 - iVar12))
              ;
              local_8c = local_8c + 1;
              printf(" %d",0);
              printf(" %d",iVar8);
              printf(" %d",0);
              printf(" %d",uVar40);
              printf(" %d");
              putchar(10);
              in_RSI = (int *)pxVar33;
            }
            pxVar33 = (htmlDocPtr)(ulong)(iVar10 + 1);
          }
          uVar40 = (ulong)(iVar9 + 1);
        }
      }
    }
    bVar45 = false;
  }
  function_tests = function_tests + 1;
  iVar8 = 0;
  for (uVar47 = 0; uVar47 != 5; uVar47 = uVar47 + 1) {
    iVar9 = xmlMemBlocks();
    pxVar35 = gen_const_xmlChar_ptr(uVar47,(int)in_RSI);
    htmlEntityLookup(pxVar35);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar10 = xmlMemBlocks();
    if (iVar9 != iVar10) {
      iVar10 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlEntityLookup",(ulong)(uint)(iVar10 - iVar9));
      iVar8 = iVar8 + 1;
      in_RSI = (int *)(ulong)uVar47;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  puVar42 = &DAT_00149080;
  iVar9 = 0;
  for (uVar47 = 0; uVar47 != 3; uVar47 = uVar47 + 1) {
    iVar10 = xmlMemBlocks();
    htmlEntityValueLookup(*puVar42);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar11 = xmlMemBlocks();
    if (iVar10 != iVar11) {
      iVar11 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlEntityValueLookup",(ulong)(uint)(iVar11 - iVar10));
      iVar9 = iVar9 + 1;
      in_RSI = (int *)(ulong)uVar47;
      printf(" %d");
      putchar(10);
    }
    puVar42 = puVar42 + 1;
  }
  function_tests = function_tests + 1;
  iVar10 = 0;
  for (uVar47 = 0; uVar47 != 4; uVar47 = uVar47 + 1) {
    iVar11 = xmlMemBlocks();
    iVar12 = gen_int(uVar47,(int)in_RSI);
    htmlHandleOmittedElem(iVar12);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar12 = xmlMemBlocks();
    if (iVar11 != iVar12) {
      iVar12 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlHandleOmittedElem",(ulong)(uint)(iVar12 - iVar11));
      iVar10 = iVar10 + 1;
      in_RSI = (int *)(ulong)uVar47;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar11 = xmlMemBlocks();
  htmlInitAutoClose();
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar12 = xmlMemBlocks();
  iVar39 = 0;
  if (iVar11 != iVar12) {
    iVar13 = xmlMemBlocks();
    in_RSI = (int *)(ulong)(uint)(iVar13 - iVar11);
    printf("Leak of %d blocks found in htmlInitAutoClose");
    putchar(10);
  }
  function_tests = function_tests + 1;
  iVar13 = 0;
  for (; iVar39 != 3; iVar39 = iVar39 + 1) {
    bVar45 = true;
    while (iVar15 = (int)in_RSI, bVar45) {
      iVar14 = xmlMemBlocks();
      pxVar29 = gen_htmlDocPtr(iVar39,iVar15);
      in_RSI = (int *)0x0;
      htmlIsAutoClosed(pxVar29);
      call_tests = call_tests + 1;
      des_htmlDocPtr((int)pxVar29,(htmlDocPtr)in_RSI,nr_00);
      xmlResetLastError();
      iVar15 = xmlMemBlocks();
      if (iVar14 == iVar15) break;
      iVar15 = xmlMemBlocks();
      bVar45 = false;
      printf("Leak of %d blocks found in htmlIsAutoClosed",(ulong)(uint)(iVar15 - iVar14));
      iVar13 = iVar13 + 1;
      printf(" %d");
      in_RSI = (int *)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar39 = 0;
  for (uVar47 = 0; uVar47 != 5; uVar47 = uVar47 + 1) {
    iVar15 = xmlMemBlocks();
    pxVar35 = gen_const_xmlChar_ptr(uVar47,(int)in_RSI);
    htmlIsScriptAttribute(pxVar35);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar14 = xmlMemBlocks();
    if (iVar15 != iVar14) {
      iVar14 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlIsScriptAttribute",(ulong)(uint)(iVar14 - iVar15));
      iVar39 = iVar39 + 1;
      in_RSI = (int *)(ulong)uVar47;
      printf(" %d");
      putchar(10);
    }
  }
  test_ret_2 = (int)(iVar11 != iVar12);
  function_tests = function_tests + 1;
  iVar11 = xmlMemBlocks();
  pxVar31 = (htmlParserCtxtPtr)htmlNewParserCtxt();
  desret_htmlParserCtxtPtr(pxVar31);
  call_tests = call_tests + 1;
  xmlResetLastError();
  iVar12 = xmlMemBlocks();
  if (iVar11 != iVar12) {
    iVar15 = xmlMemBlocks();
    in_RSI = (int *)(ulong)(uint)(iVar15 - iVar11);
    printf("Leak of %d blocks found in htmlNewParserCtxt");
    putchar(10);
  }
  function_tests = function_tests + 1;
  bVar45 = true;
  iVar15 = 0;
  while (bVar45) {
    for (uVar47 = 0; uVar47 != 3; uVar47 = uVar47 + 1) {
      iVar14 = xmlMemBlocks();
      in_RSI = &call_tests;
      if (uVar47 != 0) {
        if (uVar47 == 1) {
          in_RSI = (int *)0xffffffffffffffff;
        }
        else {
          in_RSI = (int *)0x0;
        }
      }
      pxVar31 = (htmlParserCtxtPtr)htmlNewSAXParserCtxt(0);
      desret_htmlParserCtxtPtr(pxVar31);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar16 = xmlMemBlocks();
      if (iVar14 != iVar16) {
        iVar16 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlNewSAXParserCtxt",(ulong)(uint)(iVar16 - iVar14));
        iVar15 = iVar15 + 1;
        printf(" %d",0);
        in_RSI = (int *)(ulong)uVar47;
        printf(" %d");
        putchar(10);
      }
    }
    bVar45 = false;
  }
  function_tests = function_tests + 1;
  bVar45 = true;
  test_ret_1 = 0;
  while (bVar45) {
    for (uVar47 = 0; iVar14 = (int)in_RSI, uVar47 != 4; uVar47 = uVar47 + 1) {
      iVar16 = xmlMemBlocks();
      uVar6 = gen_int(uVar47,iVar14);
      in_RSI = (int *)(ulong)uVar6;
      htmlNodeStatus();
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar14 = xmlMemBlocks();
      if (iVar16 != iVar14) {
        iVar14 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlNodeStatus",(ulong)(uint)(iVar14 - iVar16));
        test_ret_1 = test_ret_1 + 1;
        printf(" %d",0);
        in_RSI = (int *)(ulong)uVar47;
        printf(" %d");
        putchar(10);
      }
    }
    bVar45 = false;
  }
  function_tests = function_tests + 1;
  iVar14 = 0;
  pxVar29 = (htmlDocPtr)0x0;
  while (iVar16 = (int)pxVar29, iVar16 != 3) {
    iVar17 = xmlMemBlocks();
    pxVar31 = gen_htmlParserCtxtPtr(iVar16,(int)in_RSI);
    htmlParseCharRef();
    call_tests = call_tests + 1;
    if (pxVar31 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar18 = xmlMemBlocks();
    if (iVar17 != iVar18) {
      iVar18 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseCharRef",(ulong)(uint)(iVar18 - iVar17));
      iVar14 = iVar14 + 1;
      printf(" %d");
      putchar(10);
      in_RSI = (int *)pxVar29;
    }
    pxVar29 = (htmlDocPtr)(ulong)(iVar16 + 1);
  }
  function_tests = function_tests + 1;
  iVar16 = 0;
  for (iVar17 = 0; iVar17 != 3; iVar17 = iVar17 + 1) {
    for (iVar18 = 0; iVar18 != 4; iVar18 = iVar18 + 1) {
      uVar40 = 0;
      while (iVar23 = (int)uVar40, iVar23 != 4) {
        for (uVar47 = 0; iVar21 = (int)in_RSI, uVar47 != 4; uVar47 = uVar47 + 1) {
          iVar19 = xmlMemBlocks();
          pxVar31 = gen_htmlParserCtxtPtr(iVar17,iVar21);
          if (iVar18 == 0) {
            bVar45 = false;
            in_RSI = (int *)0x149278;
          }
          else if (iVar18 == 2) {
            bVar45 = false;
            in_RSI = (int *)"test/ent2";
          }
          else if (iVar18 == 1) {
            bVar45 = false;
            in_RSI = (int *)0x14990f;
          }
          else {
            bVar45 = true;
            in_RSI = (int *)0x0;
          }
          iVar20 = gen_int(iVar23,iVar21);
          iVar21 = gen_int(uVar47,iVar21);
          if ((!bVar45) && (iVar22 = xmlStrlen(in_RSI), iVar22 < iVar20)) {
            iVar20 = 0;
          }
          htmlParseChunk(pxVar31,in_RSI,iVar20,iVar21);
          if (pxVar31 == (htmlParserCtxtPtr)0x0) {
            call_tests = call_tests + 1;
          }
          else {
            xmlFreeDoc(pxVar31->myDoc);
            pxVar31->myDoc = (xmlDocPtr)0x0;
            call_tests = call_tests + 1;
            htmlFreeParserCtxt();
          }
          xmlResetLastError();
          iVar21 = xmlMemBlocks();
          if (iVar19 != iVar21) {
            iVar21 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlParseChunk",(ulong)(uint)(iVar21 - iVar19));
            iVar16 = iVar16 + 1;
            printf(" %d",iVar17);
            printf(" %d",iVar18);
            printf(" %d",uVar40);
            in_RSI = (int *)(ulong)uVar47;
            printf(" %d");
            putchar(10);
          }
        }
        uVar40 = (ulong)(iVar23 + 1);
      }
    }
  }
  function_tests = function_tests + 1;
  iVar17 = 0;
  for (uVar47 = 0; uVar47 != 5; uVar47 = uVar47 + 1) {
    pxVar29 = (htmlDocPtr)0x0;
    puVar41 = &DAT_00159d68;
    while( true ) {
      iVar18 = (int)in_RSI;
      uVar6 = (uint)pxVar29;
      if (uVar6 == 4) break;
      iVar23 = xmlMemBlocks();
      pxVar35 = gen_const_xmlChar_ptr(uVar47,iVar18);
      if (uVar6 < 3) {
        in_RSI = (int *)*puVar41;
      }
      else {
        in_RSI = (int *)0x0;
      }
      pxVar33 = (htmlDocPtr)htmlParseDoc(pxVar35);
      desret_htmlDocPtr(pxVar33);
      call_tests = call_tests + 1;
      xmlResetLastError();
      iVar18 = xmlMemBlocks();
      if (iVar23 != iVar18) {
        iVar18 = xmlMemBlocks();
        printf("Leak of %d blocks found in htmlParseDoc",(ulong)(uint)(iVar18 - iVar23));
        iVar17 = iVar17 + 1;
        printf(" %d",(ulong)uVar47);
        printf(" %d");
        putchar(10);
        in_RSI = (int *)pxVar29;
      }
      pxVar29 = (htmlDocPtr)(ulong)(uVar6 + 1);
      puVar41 = puVar41 + 1;
    }
  }
  function_tests = function_tests + 1;
  iVar18 = 0;
  for (uVar47 = 0; uVar47 != 3; uVar47 = uVar47 + 1) {
    iVar23 = xmlMemBlocks();
    pxVar31 = gen_htmlParserCtxtPtr(uVar47,(int)in_RSI);
    htmlParseDocument();
    if (pxVar31 == (htmlParserCtxtPtr)0x0) {
      call_tests = call_tests + 1;
    }
    else {
      xmlFreeDoc(pxVar31->myDoc);
      pxVar31->myDoc = (xmlDocPtr)0x0;
      call_tests = call_tests + 1;
      htmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar21 = xmlMemBlocks();
    if (iVar23 != iVar21) {
      iVar21 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseDocument",(ulong)(uint)(iVar21 - iVar23));
      iVar18 = iVar18 + 1;
      in_RSI = (int *)(ulong)uVar47;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar23 = 0;
  for (uVar47 = 0; uVar47 != 3; uVar47 = uVar47 + 1) {
    iVar21 = xmlMemBlocks();
    pxVar31 = gen_htmlParserCtxtPtr(uVar47,(int)in_RSI);
    htmlParseElement();
    call_tests = call_tests + 1;
    if (pxVar31 != (htmlParserCtxtPtr)0x0) {
      htmlFreeParserCtxt();
    }
    xmlResetLastError();
    iVar19 = xmlMemBlocks();
    if (iVar21 != iVar19) {
      iVar19 = xmlMemBlocks();
      printf("Leak of %d blocks found in htmlParseElement",(ulong)(uint)(iVar19 - iVar21));
      iVar23 = iVar23 + 1;
      in_RSI = (int *)(ulong)uVar47;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar21 = 0;
  for (iVar19 = 0; iVar19 != 3; iVar19 = iVar19 + 1) {
    bVar45 = true;
    while (iVar20 = (int)in_RSI, bVar45) {
      iVar22 = xmlMemBlocks();
      pxVar31 = gen_htmlParserCtxtPtr(iVar19,iVar20);
      in_RSI = (int *)0x0;
      htmlParseEntityRef();
      call_tests = call_tests + 1;
      if (pxVar31 != (htmlParserCtxtPtr)0x0) {
        htmlFreeParserCtxt();
      }
      xmlResetLastError();
      iVar20 = xmlMemBlocks();
      if (iVar22 == iVar20) break;
      iVar20 = xmlMemBlocks();
      bVar45 = false;
      printf("Leak of %d blocks found in htmlParseEntityRef",(ulong)(uint)(iVar20 - iVar22));
      iVar21 = iVar21 + 1;
      printf(" %d");
      in_RSI = (int *)0x0;
      printf(" %d");
      putchar(10);
    }
  }
  function_tests = function_tests + 1;
  iVar19 = 0;
LAB_001181e6:
  if (iVar19 == 8) {
    function_tests = function_tests + 1;
    local_4c = 0;
    for (iVar19 = 0; iVar19 != 5; iVar19 = iVar19 + 1) {
      uVar40 = 0;
      while (uVar47 = (uint)uVar40, uVar47 != 4) {
        for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
          pxVar29 = (htmlDocPtr)0x0;
          while( true ) {
            iVar22 = (int)in_RSI;
            iVar20 = (int)pxVar29;
            if (iVar20 == 4) break;
            iVar24 = xmlMemBlocks();
            pxVar35 = gen_const_xmlChar_ptr(iVar19,iVar22);
            if (uVar47 < 3) {
              in_RSI = (int *)(&DAT_00159d68)[uVar40];
            }
            else {
              in_RSI = (int *)0x0;
            }
            if (uVar6 < 3) {
              uVar44 = (&DAT_00159d68)[uVar6];
            }
            else {
              uVar44 = 0;
            }
            iVar22 = gen_int(iVar20,iVar22);
            pxVar33 = (htmlDocPtr)htmlReadDoc(pxVar35,in_RSI,uVar44,iVar22);
            desret_htmlDocPtr(pxVar33);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar22 = xmlMemBlocks();
            if (iVar24 != iVar22) {
              iVar22 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlReadDoc",(ulong)(uint)(iVar22 - iVar24));
              local_4c = local_4c + 1;
              printf(" %d",iVar19);
              printf(" %d",uVar40);
              printf(" %d",uVar6);
              printf(" %d");
              putchar(10);
              in_RSI = (int *)pxVar29;
            }
            pxVar29 = (htmlDocPtr)(ulong)(iVar20 + 1);
          }
        }
        uVar40 = (ulong)(uVar47 + 1);
      }
    }
    function_tests = function_tests + 1;
    local_50 = 0;
    for (uVar47 = 0; uVar47 != 8; uVar47 = uVar47 + 1) {
      uVar40 = 0;
      while (uVar6 = (uint)uVar40, uVar6 != 4) {
        pxVar29 = (htmlDocPtr)0x0;
        while( true ) {
          iVar19 = (int)in_RSI;
          iVar20 = (int)pxVar29;
          if (iVar20 == 4) break;
          iVar22 = xmlMemBlocks();
          pcVar30 = gen_filepath(uVar47,iVar19);
          if (uVar6 < 3) {
            in_RSI = (int *)(&DAT_00159d68)[uVar40];
          }
          else {
            in_RSI = (int *)0x0;
          }
          iVar19 = gen_int(iVar20,iVar19);
          pxVar33 = (htmlDocPtr)htmlReadFile(pcVar30,in_RSI,iVar19);
          desret_htmlDocPtr(pxVar33);
          call_tests = call_tests + 1;
          xmlResetLastError();
          iVar19 = xmlMemBlocks();
          if (iVar22 != iVar19) {
            iVar19 = xmlMemBlocks();
            printf("Leak of %d blocks found in htmlReadFile",(ulong)(uint)(iVar19 - iVar22));
            local_50 = local_50 + 1;
            printf(" %d",(ulong)uVar47);
            printf(" %d",uVar40);
            printf(" %d");
            putchar(10);
            in_RSI = (int *)pxVar29;
          }
          pxVar29 = (htmlDocPtr)(ulong)(iVar20 + 1);
        }
        uVar40 = (ulong)(uVar6 + 1);
      }
    }
    function_tests = function_tests + 1;
    iVar19 = 0;
    for (uVar47 = 0; uVar47 != 4; uVar47 = uVar47 + 1) {
      for (uVar6 = 0; uVar6 != 4; uVar6 = uVar6 + 1) {
        for (uVar7 = 0; uVar7 != 4; uVar7 = uVar7 + 1) {
          uVar40 = 0;
          while (uVar38 = (uint)uVar40, uVar38 != 4) {
            for (no = 0; iVar20 = (int)in_RSI, no != 4; no = no + 1) {
              iVar22 = xmlMemBlocks();
              if (uVar47 == 0) {
                bVar45 = false;
                pcVar30 = "foo";
              }
              else if (uVar47 == 2) {
                bVar45 = false;
                pcVar30 = "test/ent2";
              }
              else if (uVar47 == 1) {
                bVar45 = false;
                pcVar30 = "<foo/>";
              }
              else {
                bVar45 = true;
                pcVar30 = (char *)0x0;
              }
              uVar25 = gen_int(uVar6,iVar20);
              if (uVar7 < 3) {
                uVar44 = (&DAT_00159d68)[uVar7];
              }
              else {
                uVar44 = 0;
              }
              if (uVar38 < 3) {
                uVar37 = (&DAT_00159d68)[uVar40];
              }
              else {
                uVar37 = 0;
              }
              iVar20 = gen_int(no,iVar20);
              if ((!bVar45) && (iVar24 = xmlStrlen(pcVar30), iVar24 < (int)uVar25)) {
                uVar25 = 0;
              }
              in_RSI = (int *)(ulong)uVar25;
              pxVar29 = (htmlDocPtr)htmlReadMemory(pcVar30,in_RSI,uVar44,uVar37,iVar20);
              desret_htmlDocPtr(pxVar29);
              call_tests = call_tests + 1;
              xmlResetLastError();
              iVar20 = xmlMemBlocks();
              if (iVar22 != iVar20) {
                iVar20 = xmlMemBlocks();
                printf("Leak of %d blocks found in htmlReadMemory",(ulong)(uint)(iVar20 - iVar22));
                iVar19 = iVar19 + 1;
                printf(" %d",(ulong)uVar47);
                printf(" %d",(ulong)uVar6);
                printf(" %d",uVar7);
                printf(" %d",uVar40);
                in_RSI = (int *)(ulong)no;
                printf(" %d");
                putchar(10);
              }
            }
            uVar40 = (ulong)(uVar38 + 1);
          }
        }
      }
    }
    function_tests = function_tests + 1;
    iVar20 = 0;
    for (uVar47 = 0; uVar47 != 5; uVar47 = uVar47 + 1) {
      uVar40 = 0;
      while (uVar6 = (uint)uVar40, uVar6 != 4) {
        bVar45 = true;
        while (bVar45) {
          pxVar29 = (htmlDocPtr)0x0;
          while( true ) {
            iVar22 = (int)in_RSI;
            iVar24 = (int)pxVar29;
            if (iVar24 == 3) break;
            iVar26 = xmlMemBlocks();
            pxVar35 = gen_const_xmlChar_ptr(uVar47,iVar22);
            if (uVar6 < 3) {
              in_RSI = (int *)(&DAT_00159d68)[uVar40];
            }
            else {
              in_RSI = (int *)0x0;
            }
            piVar36 = &call_tests;
            if (iVar24 != 0) {
              if (iVar24 == 1) {
                piVar36 = (int *)0xffffffffffffffff;
              }
              else {
                piVar36 = (int *)0x0;
              }
            }
            pxVar33 = (htmlDocPtr)htmlSAXParseDoc(pxVar35,in_RSI,0,piVar36);
            desret_htmlDocPtr(pxVar33);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar22 = xmlMemBlocks();
            if (iVar26 != iVar22) {
              iVar22 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlSAXParseDoc",(ulong)(uint)(iVar22 - iVar26));
              iVar20 = iVar20 + 1;
              printf(" %d",(ulong)uVar47);
              printf(" %d",uVar40);
              printf(" %d",0);
              printf(" %d");
              putchar(10);
              in_RSI = (int *)pxVar29;
            }
            pxVar29 = (htmlDocPtr)(ulong)(iVar24 + 1);
          }
          bVar45 = false;
        }
        uVar40 = (ulong)(uVar6 + 1);
      }
    }
    function_tests = function_tests + 1;
    iVar22 = 0;
    for (uVar47 = 0; uVar47 != 8; uVar47 = uVar47 + 1) {
      uVar40 = 0;
      while (uVar6 = (uint)uVar40, uVar6 != 4) {
        bVar45 = true;
        while (bVar45) {
          pxVar29 = (htmlDocPtr)0x0;
          while( true ) {
            iVar24 = (int)in_RSI;
            iVar26 = (int)pxVar29;
            if (iVar26 == 3) break;
            iVar27 = xmlMemBlocks();
            pcVar30 = gen_filepath(uVar47,iVar24);
            if (uVar6 < 3) {
              in_RSI = (int *)(&DAT_00159d68)[uVar40];
            }
            else {
              in_RSI = (int *)0x0;
            }
            piVar36 = &call_tests;
            if (iVar26 != 0) {
              if (iVar26 == 1) {
                piVar36 = (int *)0xffffffffffffffff;
              }
              else {
                piVar36 = (int *)0x0;
              }
            }
            pxVar33 = (htmlDocPtr)htmlSAXParseFile(pcVar30,in_RSI,0,piVar36);
            desret_htmlDocPtr(pxVar33);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar24 = xmlMemBlocks();
            if (iVar27 != iVar24) {
              iVar24 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlSAXParseFile",(ulong)(uint)(iVar24 - iVar27));
              iVar22 = iVar22 + 1;
              printf(" %d",(ulong)uVar47);
              printf(" %d",uVar40);
              printf(" %d",0);
              printf(" %d");
              putchar(10);
              in_RSI = (int *)pxVar29;
            }
            pxVar29 = (htmlDocPtr)(ulong)(iVar26 + 1);
          }
          bVar45 = false;
        }
        uVar40 = (ulong)(uVar6 + 1);
      }
    }
    function_tests = function_tests + 1;
    bVar45 = true;
    iVar24 = 0;
    while (bVar45) {
      for (uVar47 = 0; uVar47 != 2; uVar47 = uVar47 + 1) {
        uVar44 = 0;
        if (uVar47 == 0) {
          uVar44 = 0x15c404;
        }
        bVar45 = true;
        while (bVar45) {
          uVar40 = 0;
          while (iVar26 = (int)uVar40, iVar26 != 2) {
            iVar27 = xmlMemBlocks();
            uVar37 = 0;
            if (iVar26 == 0) {
              uVar37 = 0x15c40c;
            }
            htmlUTF8ToHtml(0,uVar44,0,uVar37);
            call_tests = call_tests + 1;
            xmlResetLastError();
            iVar28 = xmlMemBlocks();
            if (iVar27 != iVar28) {
              iVar28 = xmlMemBlocks();
              printf("Leak of %d blocks found in htmlUTF8ToHtml",(ulong)(uint)(iVar28 - iVar27));
              iVar24 = iVar24 + 1;
              printf(" %d",0);
              printf(" %d",(ulong)uVar47);
              printf(" %d",0);
              printf(" %d",uVar40);
              putchar(10);
            }
            uVar40 = (ulong)(iVar26 + 1);
          }
          bVar45 = false;
        }
      }
      bVar45 = false;
    }
    function_tests = function_tests + 1;
    uVar47 = local_8c + iVar8 + iVar1 + iVar2 + iVar5 + iVar43 + iVar3 + iVar4 + iVar9 + iVar10 +
             test_ret_2 + iVar13 + iVar39 + (uint)(iVar11 != iVar12) + iVar15 + test_ret_1 + iVar14
             + iVar16 + iVar17 + iVar18 + iVar23 + iVar21 + local_4c + local_50 + iVar19 + iVar20 +
             iVar22 + iVar24;
    if (uVar47 != 0) {
      printf("Module HTMLparser: %d errors\n",(ulong)uVar47);
    }
    return uVar47;
  }
  pcVar30 = gen_filepath(iVar19,(int)in_RSI);
  iVar20 = 0;
  do {
    pcVar32 = "foo";
    switch(iVar20) {
    case 0:
      break;
    case 1:
      pcVar32 = "<foo/>";
      break;
    case 2:
      pcVar32 = "test/ent2";
      break;
    default:
      pcVar32 = (char *)0x0;
      break;
    case 4:
      goto switchD_0011820b_caseD_4;
    }
    pxVar29 = (htmlDocPtr)htmlParseFile(pcVar30,pcVar32);
    desret_htmlDocPtr(pxVar29);
    call_tests = call_tests + 1;
    xmlResetLastError();
    iVar20 = iVar20 + 1;
  } while( true );
switchD_0011820b_caseD_4:
  iVar19 = iVar19 + 1;
  in_RSI = (int *)(htmlDocPtr)0x149278;
  goto LAB_001181e6;
}

Assistant:

static int
test_HTMLparser(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing HTMLparser : 37 of 43 functions ...\n");
    test_ret += test_htmlAttrAllowed();
    test_ret += test_htmlAutoCloseTag();
    test_ret += test_htmlCreateFileParserCtxt();
    test_ret += test_htmlCreateMemoryParserCtxt();
    test_ret += test_htmlCreatePushParserCtxt();
    test_ret += test_htmlCtxtParseDocument();
    test_ret += test_htmlCtxtReadDoc();
    test_ret += test_htmlCtxtReadFile();
    test_ret += test_htmlCtxtReadMemory();
    test_ret += test_htmlCtxtReset();
    test_ret += test_htmlCtxtSetOptions();
    test_ret += test_htmlCtxtUseOptions();
    test_ret += test_htmlElementAllowedHere();
    test_ret += test_htmlElementStatusHere();
    test_ret += test_htmlEncodeEntities();
    test_ret += test_htmlEntityLookup();
    test_ret += test_htmlEntityValueLookup();
    test_ret += test_htmlHandleOmittedElem();
    test_ret += test_htmlInitAutoClose();
    test_ret += test_htmlIsAutoClosed();
    test_ret += test_htmlIsScriptAttribute();
    test_ret += test_htmlNewParserCtxt();
    test_ret += test_htmlNewSAXParserCtxt();
    test_ret += test_htmlNodeStatus();
    test_ret += test_htmlParseCharRef();
    test_ret += test_htmlParseChunk();
    test_ret += test_htmlParseDoc();
    test_ret += test_htmlParseDocument();
    test_ret += test_htmlParseElement();
    test_ret += test_htmlParseEntityRef();
    test_ret += test_htmlParseFile();
    test_ret += test_htmlReadDoc();
    test_ret += test_htmlReadFile();
    test_ret += test_htmlReadMemory();
    test_ret += test_htmlSAXParseDoc();
    test_ret += test_htmlSAXParseFile();
    test_ret += test_htmlTagLookup();
    test_ret += test_htmlUTF8ToHtml();

    if (test_ret != 0)
	printf("Module HTMLparser: %d errors\n", test_ret);
    return(test_ret);
}